

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void sort_constraints(TCGOpDef *def,int start,int n)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  TCGArgConstraint *pTVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  if (0 < n) {
    piVar3 = def->sorted_args;
    uVar7 = 0;
    do {
      piVar3[(long)start + uVar7] = start + (int)uVar7;
      uVar7 = uVar7 + 1;
    } while ((uint)n != uVar7);
  }
  if (1 < n) {
    piVar3 = def->sorted_args;
    pTVar4 = def->args_ct;
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar7 + 1;
      uVar8 = uVar5;
      do {
        iVar1 = piVar3[(long)start + uVar7];
        iVar11 = 0x20;
        iVar9 = 0x20;
        if ((-1 < (char)pTVar4[iVar1].ct) && (iVar9 = 0, (pTVar4[iVar1].ct & 1) != 0)) {
          iVar9 = 0;
          uVar10 = 0;
          do {
            iVar9 = iVar9 + (uint)((pTVar4[iVar1].u.regs >> (uVar10 & 0x1f) & 1) != 0);
            uVar10 = uVar10 + 1;
          } while (uVar10 != 0x20);
          iVar9 = 0x21 - iVar9;
        }
        iVar2 = piVar3[(long)start + uVar8];
        if ((-1 < (char)pTVar4[iVar2].ct) && (iVar11 = 0, (pTVar4[iVar2].ct & 1) != 0)) {
          iVar11 = 0;
          uVar10 = 0;
          do {
            iVar11 = iVar11 + (uint)((pTVar4[iVar2].u.regs >> (uVar10 & 0x1f) & 1) != 0);
            uVar10 = uVar10 + 1;
          } while (uVar10 != 0x20);
          iVar11 = 0x21 - iVar11;
        }
        if (iVar9 < iVar11) {
          piVar3[(long)start + uVar7] = iVar2;
          piVar3[(long)start + uVar8] = iVar1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != (uint)n);
      uVar5 = uVar5 + 1;
      uVar7 = uVar6;
    } while (uVar6 != n - 1);
  }
  return;
}

Assistant:

static void sort_constraints(TCGOpDef *def, int start, int n)
{
    int i, j, p1, p2, tmp;

    for(i = 0; i < n; i++)
        def->sorted_args[start + i] = start + i;
    if (n <= 1)
        return;
    for(i = 0; i < n - 1; i++) {
        for(j = i + 1; j < n; j++) {
            p1 = get_constraint_priority(def, def->sorted_args[start + i]);
            p2 = get_constraint_priority(def, def->sorted_args[start + j]);
            if (p1 < p2) {
                tmp = def->sorted_args[start + i];
                def->sorted_args[start + i] = def->sorted_args[start + j];
                def->sorted_args[start + j] = tmp;
            }
        }
    }
}